

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

void __thiscall QProgressBar::paintEvent(QProgressBar *this,QPaintEvent *param_1)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QStylePainter local_b8;
  QStyleOptionProgressBar opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(&local_b8,&this->super_QWidget);
  opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  opt._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionProgressBar::QStyleOptionProgressBar(&opt);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this,&opt);
  QStylePainter::drawControl(&local_b8,CE_ProgressBar,&opt.super_QStyleOption);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  *(undefined4 *)(lVar2 + 0x268) = *(undefined4 *)(lVar2 + 0x25c);
  QStyleOptionProgressBar::~QStyleOptionProgressBar(&opt);
  QPainter::~QPainter(&local_b8.super_QPainter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::paintEvent(QPaintEvent *)
{
    QStylePainter paint(this);
    QStyleOptionProgressBar opt;
    initStyleOption(&opt);
    paint.drawControl(QStyle::CE_ProgressBar, opt);
    d_func()->lastPaintedValue = d_func()->value;
}